

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O1

void __thiscall FSlide::SlideMove(FSlide *this,AActor *mo,DVector2 *tryp,int numsteps)

{
  player_t *ppVar1;
  bool bVar2;
  secplane_t *psVar3;
  byte bVar4;
  int iVar5;
  double dVar6;
  double dVar7;
  DVector2 move;
  DVector2 lead;
  DVector2 local_a8;
  DVector2 local_98;
  double local_88;
  undefined8 uStack_80;
  double local_78;
  undefined8 uStack_70;
  DVector2 local_60;
  DVector2 *local_50;
  double local_48;
  double local_40;
  double local_38;
  
  this->slidemo = mo;
  if (((mo->player == (player_t *)0x0) || (mo->player->mo != (APlayerPawn *)mo)) ||
     (mo->reactiontime < 1)) {
    local_48 = (double)numsteps;
    local_50 = &this->tmmove;
    iVar5 = -3;
    do {
      iVar5 = iVar5 + 1;
      if (iVar5 == 0) {
LAB_00511cec:
        local_a8.Y = tryp->Y;
        local_a8.X = 0.0;
        psVar3 = P_CheckSlopeWalk(mo,&local_a8);
        local_98.X = (mo->__Pos).X + local_a8.X;
        local_98.Y = (mo->__Pos).Y + local_a8.Y;
        bVar2 = P_TryMove(mo,&local_98,1,psVar3);
        if (bVar2) {
          return;
        }
        local_a8.X = tryp->X;
        local_a8.Y = 0.0;
        psVar3 = P_CheckSlopeWalk(mo,&local_a8);
        local_98.X = (mo->__Pos).X + local_a8.X;
        local_98.Y = (mo->__Pos).Y + local_a8.Y;
        P_TryMove(mo,&local_98,1,psVar3);
        return;
      }
      local_a8.X = tryp->X;
      if (local_a8.X <= 0.0) {
        local_78 = (mo->__Pos).X;
        local_60.X = local_78 - mo->radius;
        local_78 = local_78 + mo->radius;
      }
      else {
        local_78 = (mo->__Pos).X;
        local_60.X = local_78 + mo->radius;
        local_78 = local_78 - mo->radius;
      }
      local_a8.Y = tryp->Y;
      if (local_a8.Y <= 0.0) {
        local_88 = (mo->__Pos).Y;
        local_60.Y = local_88 - mo->radius;
        local_88 = local_88 + mo->radius;
      }
      else {
        local_88 = (mo->__Pos).Y;
        local_60.Y = local_88 + mo->radius;
        local_88 = local_88 - mo->radius;
      }
      this->bestSlidefrac = 1.01;
      local_a8.X = local_a8.X + local_60.X;
      local_a8.Y = local_a8.Y + local_60.Y;
      local_40 = local_60.Y;
      local_38 = local_60.X;
      SlideTraverse(this,&local_60,&local_a8);
      local_a8.X = local_78;
      local_a8.Y = local_40;
      local_98.X = local_78 + tryp->X;
      local_98.Y = local_40 + tryp->Y;
      SlideTraverse(this,&local_a8,&local_98);
      local_a8.X = local_38;
      local_a8.Y = local_88;
      local_98.X = local_38 + tryp->X;
      local_98.Y = local_88 + tryp->Y;
      SlideTraverse(this,&local_a8,&local_98);
      if (1.0 < this->bestSlidefrac) goto LAB_00511cec;
      dVar6 = this->bestSlidefrac + -0.03125;
      this->bestSlidefrac = dVar6;
      if (0.0 < dVar6) {
        local_88 = (mo->Vel).X;
        uStack_80 = 0;
        local_78 = (mo->Vel).Y;
        uStack_70 = 0;
        local_a8.X = tryp->X * dVar6 + (mo->__Pos).X;
        local_a8.Y = dVar6 * tryp->Y + (mo->__Pos).Y;
        bVar2 = P_TryMove(mo,&local_a8,1,(secplane_t *)0x0);
        bVar4 = 3;
        if (bVar2) {
          bVar4 = -((mo->Vel).Y != local_78 || (mo->Vel).X != local_88) & 1;
        }
        if (bVar4 != 0) {
          if (bVar4 != 3) {
            return;
          }
          goto LAB_00511cec;
        }
      }
      dVar6 = 1.0 - (this->bestSlidefrac + 0.03125);
      this->bestSlidefrac = dVar6;
      if (dVar6 <= 1.0) {
        if (dVar6 <= 0.0) {
          return;
        }
      }
      else {
        this->bestSlidefrac = 1.0;
      }
      dVar7 = tryp->X * this->bestSlidefrac;
      dVar6 = this->bestSlidefrac * tryp->Y;
      (this->tmmove).Y = dVar6;
      (this->tmmove).X = dVar7;
      tryp->Y = dVar6;
      tryp->X = dVar7;
      HitSlideLine(this,this->bestslideline);
      dVar7 = (this->tmmove).X * local_48;
      (mo->Vel).X = dVar7;
      dVar6 = (this->tmmove).Y * local_48;
      (mo->Vel).Y = dVar6;
      ppVar1 = mo->player;
      if ((ppVar1 != (player_t *)0x0) && (ppVar1->mo == (APlayerPawn *)mo)) {
        if (ABS(dVar7) < ABS((ppVar1->Vel).X)) {
          (ppVar1->Vel).X = dVar7;
        }
        if (ABS(dVar6) < ABS((ppVar1->Vel).Y)) {
          (ppVar1->Vel).Y = dVar6;
        }
      }
      psVar3 = P_CheckSlopeWalk(mo,local_50);
      local_a8.X = (mo->__Pos).X + (this->tmmove).X;
      local_a8.Y = (mo->__Pos).Y + (this->tmmove).Y;
      bVar2 = P_TryMove(mo,&local_a8,1,psVar3);
    } while (!bVar2);
  }
  return;
}

Assistant:

void FSlide::SlideMove(AActor *mo, DVector2 tryp, int numsteps)
{
	DVector2 lead;
	DVector2 trail;
	DVector2 newpos;
	DVector2 move;
	const secplane_t * walkplane;
	int hitcount;

	hitcount = 3;
	slidemo = mo;

	if (mo->player && mo->player->mo == mo && mo->reactiontime > 0)
		return;	// player coming right out of a teleporter.

retry:
	if (!--hitcount)
		goto stairstep; 		// don't loop forever

	// trace along the three leading corners
	if (tryp.X > 0)
	{
		lead.X = mo->X() + mo->radius;
		trail.X = mo->X() - mo->radius;
	}
	else
	{
		lead.X = mo->X() - mo->radius;
		trail.X = mo->X() + mo->radius;
	}

	if (tryp.Y > 0)
	{
		lead.Y = mo->Y() + mo->radius;
		trail.Y = mo->Y() - mo->radius;
	}
	else
	{
		lead.Y = mo->Y() - mo->radius;
		trail.Y = mo->Y() + mo->radius;
	}

	bestSlidefrac = 1.01;

	SlideTraverse(lead, lead + tryp);
	SlideTraverse(DVector2(trail.X, lead.Y), tryp + DVector2(trail.X, lead.Y));
	SlideTraverse(DVector2(lead.X, trail.Y), tryp + DVector2(lead.X, trail.Y));

	// move up to the wall
	if (bestSlidefrac > 1)
	{
		// the move must have hit the middle, so stairstep
	stairstep:
		// killough 3/15/98: Allow objects to drop off ledges
		move = { 0, tryp.Y };
		walkplane = P_CheckSlopeWalk(mo, move);
		if (!P_TryMove(mo, mo->Pos() + move, true, walkplane))
		{
			move = { tryp.X, 0 };
			walkplane = P_CheckSlopeWalk(mo, move);
			P_TryMove(mo, mo->Pos() + move, true, walkplane);
		}
		return;
	}

	// fudge a bit to make sure it doesn't hit
	bestSlidefrac -= 1. / 32;
	if (bestSlidefrac > 0)
	{
		newpos = tryp * bestSlidefrac;

		// [BL] We need to abandon this function if we end up going through a teleporter
		const DVector2 startvel = mo->Vel.XY();

		// killough 3/15/98: Allow objects to drop off ledges
		if (!P_TryMove(mo, mo->Pos() + newpos, true))
			goto stairstep;

		if (mo->Vel.XY() != startvel)
			return;
	}

	// Now continue along the wall.
	bestSlidefrac = 1. - (bestSlidefrac + 1. / 32);	// remainder
	if (bestSlidefrac > 1)
		bestSlidefrac = 1;
	else if (bestSlidefrac <= 0)
		return;

	tryp = tmmove = tryp*bestSlidefrac;

	HitSlideLine(bestslideline); 	// clip the moves

	mo->Vel.X = tmmove.X * numsteps;
	mo->Vel.Y = tmmove.Y * numsteps;

	// killough 10/98: affect the bobbing the same way (but not voodoo dolls)
	if (mo->player && mo->player->mo == mo)
	{
		if (fabs(mo->player->Vel.X) > fabs(mo->Vel.X))
			mo->player->Vel.X = mo->Vel.X;
		if (fabs(mo->player->Vel.Y) > fabs(mo->Vel.Y))
			mo->player->Vel.Y = mo->Vel.Y;
	}

	walkplane = P_CheckSlopeWalk(mo, tmmove);

	// killough 3/15/98: Allow objects to drop off ledges
	if (!P_TryMove(mo, mo->Pos() + tmmove, true, walkplane))
	{
		goto retry;
	}
}